

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O0

void usage(char **argv)

{
  ostream *poVar1;
  undefined8 *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,(char *)*in_RDI);
  poVar1 = std::operator<<(poVar1," options");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "This program creates random VPack or JSON structures and validates them. (Default: VPack)"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Available format options are:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," --vpack                create VPack");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," --json                 create JSON");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --evil                 purposefully fuzz generated VPack, to test for crashes"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --iterations <number>  number of iterations (number > 0). Default: 1");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --threads <number>     number of threads (number > 0). Default: 1");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --seed <number>        number that will be used as seed for random generation (number >= 0). Default: random value"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void usage(char const* argv[]) {
  std::cout << "Usage: " << argv[0] << " options" << std::endl;
  std::cout << "This program creates random VPack or JSON structures and "
               "validates them. (Default: VPack)"
            << std::endl;
  std::cout << "Available format options are:" << std::endl;
  std::cout << " --vpack                create VPack" << std::endl;
  std::cout << " --json                 create JSON" << std::endl;
  std::cout << " --evil                 purposefully fuzz generated VPack, to "
               "test for crashes"
            << std::endl;
  std::cout
      << " --iterations <number>  number of iterations (number > 0). Default: 1"
      << std::endl;
  std::cout
      << " --threads <number>     number of threads (number > 0). Default: 1"
      << std::endl;
  std::cout << " --seed <number>        number that will be used as seed for "
               "random generation (number >= 0). Default: random value"
            << std::endl;
  std::cout << std::endl;
}